

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O0

string * StringPrintf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  allocator<char> local_139;
  undefined4 local_138;
  undefined4 local_134;
  va_list ap;
  char local_118 [8];
  char buf [256];
  char *format_local;
  
  if (in_AL != '\0') {
    local_1d8 = in_XMM0_Qa;
    local_1c8 = in_XMM1_Qa;
    local_1b8 = in_XMM2_Qa;
    local_1a8 = in_XMM3_Qa;
    local_198 = in_XMM4_Qa;
    local_188 = in_XMM5_Qa;
    local_178 = in_XMM6_Qa;
    local_168 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_208;
  ap[0]._0_8_ = &stack0x00000008;
  local_134 = 0x30;
  local_138 = 0x10;
  local_1f8 = in_RDX;
  local_1f0 = in_RCX;
  local_1e8 = in_R8;
  local_1e0 = in_R9;
  buf._248_8_ = format;
  vsnprintf(local_118,0x100,format,&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_118,&local_139);
  std::allocator<char>::~allocator(&local_139);
  return __return_storage_ptr__;
}

Assistant:

static std::string StringPrintf(const char* format, ...) {
  char buf[256];   // should be big enough for all logging
  va_list ap;
  va_start(ap, format);
  vsnprintf(buf, sizeof(buf), format, ap);
  va_end(ap);
  return buf;
}